

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Human.cpp
# Opt level: O0

void __thiscall
Human::Human(Human *this,string *id,string *name,string *last_Name,string *phone_number,
            string *user_name,string *password,string *age)

{
  string *user_name_local;
  string *phone_number_local;
  string *last_Name_local;
  string *name_local;
  string *id_local;
  Human *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->Name);
  std::__cxx11::string::string((string *)&this->Last_Name);
  std::__cxx11::string::string((string *)&this->Phone_number);
  std::__cxx11::string::string((string *)&this->User_name);
  std::__cxx11::string::string((string *)&this->Password);
  std::__cxx11::string::string((string *)&this->Age);
  std::__cxx11::string::operator=((string *)this,(string *)id);
  std::__cxx11::string::operator=((string *)&this->Name,(string *)name);
  std::__cxx11::string::operator=((string *)&this->Last_Name,(string *)last_Name);
  std::__cxx11::string::operator=((string *)&this->Phone_number,(string *)phone_number);
  std::__cxx11::string::operator=((string *)&this->User_name,(string *)user_name);
  std::__cxx11::string::operator=((string *)&this->Password,(string *)password);
  std::__cxx11::string::operator=((string *)&this->Age,(string *)age);
  return;
}

Assistant:

Human :: Human(string id,string name,string last_Name,string phone_number,string user_name,string password,string age){
    Id = id;
    Name = name;
    Last_Name =last_Name;
    Phone_number =phone_number;
    User_name = user_name;
    Password = password;
    Age = age;

}